

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test::
~Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test
          (Secp256k1_CombinePubkeySecp256k1EcErrorCaseTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Secp256k1, CombinePubkeySecp256k1EcErrorCaseTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (CombinePubkeyTestVector test_vector : combine_error_vectors) {
    EXPECT_THROW(
        ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector.pubkeys),
        CfdException);
  }
}